

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest11InhibitPolicyMapping_::
Section11ValidinhibitPolicyMappingTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section11ValidinhibitPolicyMappingTest4
          (Section11ValidinhibitPolicyMappingTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest11InhibitPolicyMapping,
                     Section11ValidinhibitPolicyMappingTest4) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitPolicyMapping1P12CACert",
                               "inhibitPolicyMapping1P12subCACert",
                               "inhibitPolicyMapping1P12subsubCACert",
                               "ValidinhibitPolicyMappingTest4EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "inhibitPolicyMapping1P12CACRL",
                              "inhibitPolicyMapping1P12subCACRL",
                              "inhibitPolicyMapping1P12subsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.11.4";
  info.should_validate = true;
  info.SetUserConstrainedPolicySet("NIST-test-policy-2");

  this->RunTest(certs, crls, info);
}